

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

char * ures_getLocaleInternal_63(UResourceBundle *resourceBundle,UErrorCode *status)

{
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resourceBundle != (UResourceBundle *)0x0) {
      return resourceBundle->fData->fName;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (char *)0x0;
}

Assistant:

U_INTERNAL const char*  U_EXPORT2
ures_getLocaleInternal(const UResourceBundle* resourceBundle, UErrorCode* status)
{
    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if (!resourceBundle) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    } else {
      return resourceBundle->fData->fName;
    }
}